

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_mulmod(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  int iVar1;
  mp_int t;
  mp_int local_40;
  
  iVar1 = mp_init(&local_40);
  if (iVar1 == 0) {
    iVar1 = mp_mul(a,b,&local_40);
    if (iVar1 == 0) {
      iVar1 = mp_mod(&local_40,c,d);
    }
    mp_clear(&local_40);
  }
  return iVar1;
}

Assistant:

int mp_mulmod (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  int     res;
  mp_int  t;

  if ((res = mp_init (&t)) != MP_OKAY) {
    return res;
  }

  if ((res = mp_mul (a, b, &t)) != MP_OKAY) {
    mp_clear (&t);
    return res;
  }

  res = mp_mod (&t, c, d);
  mp_clear (&t);

  return res;
}